

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_map.cpp
# Opt level: O1

void AM_drawLineCharacter
               (mline_t *lineguy,int lineguylines,double scale,DAngle *angle,AMColor *color,double x
               ,double y)

{
  double dVar1;
  long lVar2;
  mline_t l;
  mline_t local_78;
  double local_58;
  double local_50;
  double local_48;
  DAngle local_40;
  DAngle local_38;
  
  if (0 < lineguylines) {
    lVar2 = 0;
    local_58 = scale;
    local_50 = x;
    local_48 = y;
    do {
      local_78.a.x = *(double *)((long)&(lineguy->a).x + lVar2);
      local_78.a.y = *(double *)((long)&(lineguy->a).y + lVar2);
      if ((local_58 != 0.0) || (NAN(local_58))) {
        local_78.a.x = local_78.a.x * local_58;
        local_78.a.y = local_78.a.y * local_58;
      }
      dVar1 = angle->Degrees;
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        local_38.Degrees = dVar1;
        AM_rotate((double *)&local_78,&local_78.a.y,&local_38);
      }
      local_78.a.x = local_78.a.x + local_50;
      local_78.a.y = local_78.a.y + local_48;
      local_78.b.x = *(double *)((long)&(lineguy->b).x + lVar2);
      local_78.b.y = *(double *)((long)&(lineguy->b).y + lVar2);
      if ((local_58 != 0.0) || (NAN(local_58))) {
        local_78.b.x = local_78.b.x * local_58;
        local_78.b.y = local_78.b.y * local_58;
      }
      dVar1 = angle->Degrees;
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        local_40.Degrees = dVar1;
        AM_rotate(&local_78.b.x,&local_78.b.y,&local_40);
      }
      local_78.b.x = local_78.b.x + local_50;
      local_78.b.y = local_78.b.y + local_48;
      AM_drawMline(&local_78,color);
      lVar2 = lVar2 + 0x20;
    } while ((ulong)(uint)lineguylines << 5 != lVar2);
  }
  return;
}

Assistant:

void
AM_drawLineCharacter
( const mline_t *lineguy,
  int		lineguylines,
  double	scale,
  DAngle	angle,
  const AMColor &color,
  double	x,
  double	y )
{
	int		i;
	mline_t	l;

	for (i=0;i<lineguylines;i++) {
		l.a.x = lineguy[i].a.x;
		l.a.y = lineguy[i].a.y;

		if (scale) {
			l.a.x *= scale;
			l.a.y *= scale;
		}

		if (angle != 0)
			AM_rotate(&l.a.x, &l.a.y, angle);

		l.a.x += x;
		l.a.y += y;

		l.b.x = lineguy[i].b.x;
		l.b.y = lineguy[i].b.y;

		if (scale) {
			l.b.x *= scale;
			l.b.y *= scale;
		}

		if (angle != 0)
			AM_rotate(&l.b.x, &l.b.y, angle);

		l.b.x += x;
		l.b.y += y;

		AM_drawMline(&l, color);
	}
}